

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

void __thiscall
Js::ProbeContainer::DispatchMutationBreakpoint
          (ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  InterpreterHaltState *pIVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  ScriptContext *pSVar7;
  int *local_50;
  undefined1 *local_48;
  ProbeContainer *local_40;
  int **local_38;
  undefined1 local_30;
  int local_24;
  InterpreterHaltState *pIStack_20;
  int currentOffset;
  InterpreterHaltState *pHaltState_local;
  
  pIStack_20 = pHaltState;
  if (pHaltState->stopType != STOP_MUTATIONBREAKPOINT) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x20d,"(pHaltState->stopType == STOP_MUTATIONBREAKPOINT)",
                                "pHaltState->stopType == STOP_MUTATIONBREAKPOINT");
    if (!bVar3) goto LAB_008d7757;
    *puVar5 = 0;
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n",this,
                pIStack_20);
  bVar3 = CanDispatchHalt(this,pIStack_20);
  if (bVar3) {
    local_50 = &local_24;
    local_24 = -1;
    local_38 = &local_50;
    local_48 = (undefined1 *)&stack0xffffffffffffffe0;
    local_30 = 1;
    local_40 = this;
    InitializeLocation(this,pIStack_20,true);
    pIVar2 = pIStack_20;
    bVar3 = InterpreterHaltState::IsValid(pIStack_20);
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                  ,pIVar2,(ulong)bVar3);
    bVar3 = InterpreterHaltState::IsValid(pIStack_20);
    if (bVar3) {
      iVar4 = (*pIStack_20->topFrame->_vptr_DiagStackFrame[0xc])();
      if ((char)iVar4 != '\0') {
        local_24 = InterpreterHaltState::GetCurrentOffset(pIStack_20);
        if (local_24 < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,0x227,"(currentOffset > 0)","currentOffset > 0");
          if (!bVar3) goto LAB_008d7757;
          *puVar5 = 0;
        }
        InterpreterHaltState::SetCurrentOffset(pIStack_20,local_24 + -1);
      }
      StepController::Deactivate(&this->debugManager->stepController,pIStack_20);
      AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
      pFVar6 = InterpreterHaltState::GetFunction(pIStack_20);
      FunctionBody::CheckAndRegisterFuncToDiag(pFVar6,this->pScriptContext);
      pFVar6 = InterpreterHaltState::GetFunction(pIStack_20);
      pSVar7 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar6);
      if (pSVar7 != this->pScriptContext) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                    ,0x22f,
                                    "(pHaltState->GetFunction()->GetScriptContext() == pScriptContext)"
                                    ,
                                    "pHaltState->GetFunction()->GetScriptContext() == pScriptContext"
                                   );
        if (!bVar3) {
LAB_008d7757:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pIStack_20);
    }
    local_30 = 0;
    anon_func::FinallyObject::~FinallyObject((FinallyObject *)&local_38);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchMutationBreakpoint(InterpreterHaltState* pHaltState)
    {
        Assert(pHaltState->stopType == STOP_MUTATIONBREAKPOINT);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        // will store Current offset of the bytecode block.
        int currentOffset = -1;

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid())
            {
                // For interpreter frames, change the current location pointer of bytecode block, as it might be pointing to the next statement on the body.
                // In order to generated proper binding of mutation statement, the bytecode offset needed to be on the same span of the statement.
                // For native frames the offset is always current.
                // Move back a single byte to ensure that it falls under on the same statement.
                if (pHaltState->topFrame->IsInterpreterFrame())
                {
                    currentOffset = pHaltState->GetCurrentOffset();
                    Assert(currentOffset > 0);
                    pHaltState->SetCurrentOffset(currentOffset - 1);
                }
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                Assert(pHaltState->GetFunction()->GetScriptContext() == pScriptContext);

                haltCallbackProbe->DispatchHalt(pHaltState);
            }
        },
        [&](bool)
        {
            // Restore the current offset;
            if (currentOffset != -1 && pHaltState->topFrame->IsInterpreterFrame())
            {
                pHaltState->SetCurrentOffset(currentOffset);
            }
            DestroyLocation();
        });

    }